

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ae0418::TNoContractionPropagator::visitAggregate
          (TNoContractionPropagator *this,TVisit param_1,TIntermAggregate *node)

{
  TOperator TVar1;
  int iVar2;
  ulong uVar3;
  char *__nptr;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  reference ppTVar4;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  setup_remained_accesschain_for_next_level;
  ObjectAccessChain next_level_accesschain;
  TIntermTyped *potential_precise_node;
  undefined1 local_48 [4];
  uint precise_accesschain_index;
  ObjectAccessChain precise_accesschain_index_str;
  TIntermAggregate *node_local;
  TVisit param_1_local;
  TNoContractionPropagator *this_local;
  long *plVar5;
  
  precise_accesschain_index_str.field_2._8_8_ = node;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (TVar1 = glslang::TIntermOperator::getOp
                        ((TIntermOperator *)precise_accesschain_index_str.field_2._8_8_),
     TVar1 == EOpConstructStruct)) {
    getFrontElement((ObjectAccessChain *)local_48,&this->remained_accesschain_);
    __nptr = (char *)std::__cxx11::string::c_str();
    uVar3 = strtoul(__nptr,(char **)0x0,10);
    this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (**(code **)(*(long *)precise_accesschain_index_str.field_2._8_8_ + 400))();
    ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (this_00,uVar3 & 0xffffffff);
    iVar2 = (*(*ppTVar4)->_vptr_TIntermNode[3])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar5 != (long *)0x0) {
      subAccessChainFromSecondElement
                ((ObjectAccessChain *)
                 ((long)&setup_remained_accesschain_for_next_level.previous_state_.field_2 + 8),
                 &this->remained_accesschain_);
      std::__cxx11::string::string
                ((string *)&local_c0,
                 (string *)
                 (setup_remained_accesschain_for_next_level.previous_state_.field_2._M_local_buf + 8
                 ));
      StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::StateSettingGuard((StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_a0,&this->remained_accesschain_,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      (**(code **)(*plVar5 + 0x10))(plVar5,this);
      StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~StateSettingGuard
                ((StateSettingGuard<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_a0);
      std::__cxx11::string::~string
                ((string *)
                 (setup_remained_accesschain_for_next_level.previous_state_.field_2._M_local_buf + 8
                 ));
      std::__cxx11::string::~string((string *)local_48);
      return false;
    }
    __assert_fail("potential_precise_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                  ,0x2a9,
                  "virtual bool (anonymous namespace)::TNoContractionPropagator::visitAggregate(glslang::TVisit, glslang::TIntermAggregate *)"
                 );
  }
  return true;
}

Assistant:

bool visitAggregate(glslang::TVisit, glslang::TIntermAggregate* node) override
    {
        if (!remained_accesschain_.empty() && node->getOp() == glslang::EOpConstructStruct) {
            // This is a struct initializer node, and the remained
            // access chain is not empty, we need to refer to the
            // assignee_remained_access_chain_ to find the nested
            // 'precise' object. And we don't need to visit other nodes in this
            // aggregate node.

            // Gets the struct dereference index that leads to 'precise' object.
            ObjectAccessChain precise_accesschain_index_str =
                getFrontElement(remained_accesschain_);
            unsigned precise_accesschain_index = (unsigned)strtoul(precise_accesschain_index_str.c_str(), nullptr, 10);
            // Gets the node pointed by the access chain index extracted before.
            glslang::TIntermTyped* potential_precise_node =
                node->getSequence()[precise_accesschain_index]->getAsTyped();
            assert(potential_precise_node);
            // Pop the front access chain index from the path, and visit the nested node.
            {
                ObjectAccessChain next_level_accesschain =
                    subAccessChainFromSecondElement(remained_accesschain_);
                StateSettingGuard<ObjectAccessChain> setup_remained_accesschain_for_next_level(
                    &remained_accesschain_, next_level_accesschain);
                potential_precise_node->traverse(this);
            }
            return false;
        }
        return true;
    }